

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger thread_wakeup(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  SQInteger SVar1;
  HSQUIRRELVM dest;
  HSQUIRRELVM src;
  HSQUIRRELVM in_RDI;
  SQInteger wakeupret;
  SQInteger state;
  SQVM *thread;
  SQObjectPtr o;
  SQChar *in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  HSQUIRRELVM in_stack_ffffffffffffff88;
  SQObjectType in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  SQObjectValue in_stack_ffffffffffffffe8;
  SQObjectValue retval;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  SQRESULT SVar2;
  
  o_00 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffe0,o_00);
  if (in_stack_ffffffffffffffe0 != OT_THREAD) {
    SVar2 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    goto LAB_0012134d;
  }
  retval = in_stack_ffffffffffffffe8;
  SVar1 = sq_getvmstate(in_stack_ffffffffffffffe8.nInteger);
  if (SVar1 != 2) {
    if (SVar1 == 0) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      goto LAB_0012134d;
    }
    if (SVar1 == 1) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      goto LAB_0012134d;
    }
  }
  dest = (HSQUIRRELVM)sq_gettop(in_RDI);
  if (1 < (long)dest) {
    sq_move(dest,in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
  }
  src = (HSQUIRRELVM)
        sq_wakeupvm(in_stack_fffffffffffffff8,(SQBool)in_RDI,retval.nInteger,
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffe8.nInteger);
  if ((long)src < 0) {
    sq_settop(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
    SQObjectPtr::operator=((SQObjectPtr *)dest,(SQObjectPtr *)src);
    SVar2 = -1;
  }
  else {
    sq_move(dest,src,(SQInteger)in_stack_ffffffffffffff80);
    sq_pop(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 =
         (HSQUIRRELVM)sq_getvmstate((HSQUIRRELVM)in_stack_ffffffffffffffe8.pTable);
    if (in_stack_ffffffffffffff80 == (HSQUIRRELVM)0x0) {
      sq_settop((HSQUIRRELVM)0x0,(SQInteger)in_stack_ffffffffffffff78);
    }
    SVar2 = 1;
  }
LAB_0012134d:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  return SVar2;
}

Assistant:

static SQInteger thread_wakeup(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        SQInteger wakeupret = sq_gettop(v)>1?SQTrue:SQFalse;
        if(wakeupret) {
            sq_move(thread,v,2);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,wakeupret,SQTrue,SQTrue,SQFalse))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        v->_lasterror = thread->_lasterror;
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}